

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O2

mraa_boolean_t mraa_file_contains(char *filename,char *content)

{
  char *__filename;
  FILE *__stream;
  __ssize_t _Var1;
  char *pcVar2;
  mraa_boolean_t mVar3;
  char *line;
  size_t len;
  
  mVar3 = 0;
  if ((content != (char *)0x0 && filename != (char *)0x0) &&
     (__filename = mraa_file_unglob(filename), __filename != (char *)0x0)) {
    len = 0;
    line = (char *)0x0;
    __stream = fopen(__filename,"r");
    if (__stream == (FILE *)0x0) {
      free(__filename);
      mVar3 = 0;
    }
    else {
      mVar3 = 1;
      do {
        _Var1 = getline(&line,&len,__stream);
        if (_Var1 == -1) {
          mVar3 = 0;
          break;
        }
        pcVar2 = strstr(line,content);
      } while (pcVar2 == (char *)0x0);
      fclose(__stream);
      free(__filename);
      free(line);
    }
  }
  return mVar3;
}

Assistant:

mraa_boolean_t
mraa_file_contains(const char* filename, const char* content)
{
    mraa_boolean_t found = 0;
    if ((filename == NULL) || (content == NULL)) {
        return 0;
    }

    char* file = mraa_file_unglob(filename);
    if (file != NULL) {
        size_t len = 0;
        char* line = NULL;
        FILE* fh = fopen(file, "r");
        if (fh == NULL) {
            free(file);
            return 0;
        }
        while ((getline(&line, &len, fh) != -1) && (found == 0)) {
            if (strstr(line, content)) {
                found = 1;
                break;
            }
        }
        fclose(fh);
        free(file);
        free(line);
    }
    return found;
}